

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cpp
# Opt level: O1

bool FlatStream_BlockCheck(TBlockStream *pStream,ULONGLONG BlockOffset)

{
  uint uVar1;
  
  if ((pStream->BlockSize - 1 & (uint)BlockOffset) != 0) {
    __assert_fail("(BlockOffset & (pStream->BlockSize - 1)) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/FileStream.cpp"
                  ,0x4ad,"bool FlatStream_BlockCheck(TBlockStream *, ULONGLONG)");
  }
  if (pStream->FileBitmap != (void *)0x0) {
    uVar1 = (uint)(BlockOffset / pStream->BlockSize);
    return (*(byte *)((long)pStream->FileBitmap + (ulong)(uVar1 >> 3)) >> (uVar1 & 7) & 1) != 0;
  }
  __assert_fail("FileBitmap != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/common/FileStream.cpp"
                ,0x4ae,"bool FlatStream_BlockCheck(TBlockStream *, ULONGLONG)");
}

Assistant:

static bool FlatStream_BlockCheck(
    TBlockStream * pStream,                // Pointer to an open stream
    ULONGLONG BlockOffset)
{
    LPBYTE FileBitmap = (LPBYTE)pStream->FileBitmap;
    DWORD BlockIndex;
    BYTE BitMask;

    // Sanity checks
    assert((BlockOffset & (pStream->BlockSize - 1)) == 0);
    assert(FileBitmap != NULL);

    // Calculate the index of the block
    BlockIndex = (DWORD)(BlockOffset / pStream->BlockSize);
    BitMask = (BYTE)(1 << (BlockIndex & 0x07));

    // Check if the bit is present
    return (FileBitmap[BlockIndex / 0x08] & BitMask) ? true : false;
}